

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator f;
  iterator l;
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  size_type old_count;
  int i;
  key_type *in_stack_fffffffffffffcd8;
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffce0;
  AssertHelper *this_00;
  uint *in_stack_fffffffffffffce8;
  unsigned_long *lhs;
  char *in_stack_fffffffffffffcf0;
  char *rhs_expression;
  char *in_stack_fffffffffffffcf8;
  char *lhs_expression;
  int line;
  char *in_stack_fffffffffffffd00;
  char *file;
  undefined8 in_stack_fffffffffffffd08;
  Type type;
  AssertHelper *in_stack_fffffffffffffd10;
  AssertHelper *this_01;
  Message *in_stack_fffffffffffffd58;
  AssertHelper *in_stack_fffffffffffffd60;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd80;
  AssertionResult local_238 [2];
  size_type local_218;
  undefined4 local_20c;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe00;
  undefined1 local_1f8 [8];
  undefined8 in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe28 [48];
  undefined1 auVar2 [32];
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  Message *in_stack_fffffffffffffe90;
  AssertHelper *in_stack_fffffffffffffe98;
  undefined1 local_160 [80];
  undefined1 local_110 [8];
  AssertHelper *pAStack_108;
  unsigned_long *local_100;
  char *pcStack_f8;
  char *local_f0;
  char *pcStack_e8;
  undefined8 local_e0;
  Type TStack_dc;
  AssertHelper *pAStack_d8;
  key_type local_a4;
  size_type local_a0;
  undefined4 local_94;
  AssertionResult local_90;
  int local_7c;
  size_type local_78;
  value_type local_14;
  int local_10;
  key_type local_c;
  
  local_c = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  for (local_10 = 10; local_10 < 2000; local_10 = local_10 + 1) {
    local_14 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffce0,
                              (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  local_78 = google::
             BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xeb7157);
  for (local_7c = 10; local_7c < 1000; local_7c = local_7c + 1) {
    local_94 = 1;
    local_a4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20)
                          );
    local_a0 = google::
               BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
               (unsigned_long *)in_stack_fffffffffffffce0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd10);
      testing::AssertionResult::failure_message((AssertionResult *)0xeb722c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd10,(Type)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                 in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                 in_stack_fffffffffffffcf0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
      testing::Message::~Message((Message *)0xeb728f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb72fa);
  }
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffd80);
  memcpy(local_110,local_160,0x48);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffd80);
  memcpy(&stack0xfffffffffffffe58,local_1f8,0x48);
  f.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe18;
  f.ht = (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffe10;
  f.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe20;
  auVar2 = in_stack_fffffffffffffe28._16_32_;
  f.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe28._0_8_;
  f.pos.col_current = (const_nonempty_iterator)in_stack_fffffffffffffe28._8_8_;
  f.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       auVar2._0_8_;
  f.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       auVar2._8_8_;
  f.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       auVar2._16_8_;
  f.end.col_current = (const_nonempty_iterator)auVar2._24_8_;
  l.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe60;
  l.ht = (sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffe58;
  l.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe68;
  l.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe70;
  l.pos.col_current = (const_nonempty_iterator)in_stack_fffffffffffffe78;
  l.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe80;
  l.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe88;
  l.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffffe90;
  l.end.col_current = (const_nonempty_iterator)in_stack_fffffffffffffe98;
  type = TStack_dc;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffe00._M_head_impl,f,l);
  local_20c = 0;
  local_218 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb7445);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_f0,pcStack_f8,(uint *)local_100,(unsigned_long *)pAStack_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdf8);
  this_00 = pAStack_108;
  lhs = local_100;
  rhs_expression = pcStack_f8;
  lhs_expression = local_f0;
  file = pcStack_e8;
  this_01 = pAStack_d8;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_d8);
    testing::AssertionResult::failure_message((AssertionResult *)0xeb74ac);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_d8,type,pcStack_e8,(int)((ulong)local_f0 >> 0x20),pcStack_f8);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::~AssertHelper(pAStack_108);
    testing::Message::~Message((Message *)0xeb750f);
    this_00 = pAStack_108;
    lhs = local_100;
    rhs_expression = pcStack_f8;
    lhs_expression = local_f0;
    file = pcStack_e8;
    this_01 = pAStack_d8;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb757d);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0xeb758e);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,lhs,(unsigned_long *)this_00);
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_238);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0xeb7607);
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,line,rhs_expression);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xeb766a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb76d5);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}